

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

void addShuffleAndSeed<CoreML::Specification::NeuralNetworkClassifier>
               (NeuralNetworkClassifier *nn,int64_t defaultValue,int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  bool bVar1;
  NetworkUpdateParameters *this;
  BoolParameter *this_00;
  Int64Parameter *this_01;
  size_type sVar2;
  Int64Range *this_02;
  Int64Set *this_03;
  reference plVar3;
  long *x;
  iterator __end2;
  iterator __begin2;
  set<long,_std::less<long>,_std::allocator<long>_> *__range2;
  Int64Set *int64Set;
  Int64Range *int64Range;
  Int64Parameter *shuffleSeed;
  BoolParameter *shuffle;
  NetworkUpdateParameters *updateParameters;
  set<long,_std::less<long>,_std::allocator<long>_> *allowedValues_local;
  int64_t maxValue_local;
  int64_t minValue_local;
  int64_t defaultValue_local;
  NeuralNetworkClassifier *nn_local;
  
  this = CoreML::Specification::NeuralNetworkClassifier::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_shuffle(this);
  CoreML::Specification::BoolParameter::set_defaultvalue(this_00,true);
  this_01 = CoreML::Specification::NetworkUpdateParameters::mutable_seed(this);
  CoreML::Specification::Int64Parameter::set_defaultvalue(this_01,defaultValue);
  sVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::size(allowedValues);
  if (sVar2 == 0) {
    this_02 = CoreML::Specification::Int64Parameter::mutable_range(this_01);
    CoreML::Specification::Int64Range::set_minvalue(this_02,minValue);
    CoreML::Specification::Int64Range::set_maxvalue(this_02,maxValue);
  }
  else {
    this_03 = CoreML::Specification::Int64Parameter::mutable_set(this_01);
    __end2 = std::set<long,_std::less<long>,_std::allocator<long>_>::begin(allowedValues);
    x = (long *)std::set<long,_std::less<long>,_std::allocator<long>_>::end(allowedValues);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&x), bVar1) {
      plVar3 = std::_Rb_tree_const_iterator<long>::operator*(&__end2);
      CoreML::Specification::Int64Set::add_values(this_03,*plVar3);
      std::_Rb_tree_const_iterator<long>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void addShuffleAndSeed(NeuralNetworkClass *nn, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    auto updateParameters = nn->mutable_updateparams();
    auto shuffle = updateParameters->mutable_shuffle();
    shuffle->set_defaultvalue(true);

    auto shuffleSeed = updateParameters->mutable_seed();
    shuffleSeed->set_defaultvalue(defaultValue);

    if (allowedValues.size() == 0) {
        auto int64Range = shuffleSeed->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = shuffleSeed->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}